

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::anon_unknown_0::StderrLogSink::Send
          (StderrLogSink *this,LogEntry *entry)

{
  bool bVar1;
  LogSeverity LVar2;
  LogSeverityAtLeast rhs;
  string_view sVar3;
  string_view local_30;
  anon_class_1_0_00000001 local_19;
  LogEntry *local_18;
  LogEntry *entry_local;
  StderrLogSink *this_local;
  
  local_18 = entry;
  entry_local = (LogEntry *)this;
  LVar2 = LogEntry::log_severity(entry);
  rhs = StderrThreshold();
  bVar1 = lts_20250127::operator<(LVar2,rhs);
  if ((!bVar1) || (bVar1 = log_internal::IsInitialized(), !bVar1)) {
    call_once<absl::lts_20250127::log_internal::(anonymous_namespace)::StderrLogSink::Send(absl::lts_20250127::LogEntry_const&)::_lambda()_1_>
              (&Send::warn_if_not_initialized,&local_19);
    local_30 = LogEntry::stacktrace(local_18);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      sVar3 = LogEntry::text_message_with_prefix_and_newline(local_18);
      LVar2 = LogEntry::log_severity(local_18);
      WriteToStderr(sVar3,LVar2);
    }
    else {
      sVar3 = LogEntry::stacktrace(local_18);
      LVar2 = LogEntry::log_severity(local_18);
      WriteToStderr(sVar3,LVar2);
    }
  }
  return;
}

Assistant:

void Send(const absl::LogEntry& entry) override {
    if (entry.log_severity() < absl::StderrThreshold() &&
        absl::log_internal::IsInitialized()) {
      return;
    }

    ABSL_CONST_INIT static absl::once_flag warn_if_not_initialized;
    absl::call_once(warn_if_not_initialized, []() {
      if (absl::log_internal::IsInitialized()) return;
      const char w[] =
          "WARNING: All log messages before absl::InitializeLog() is called"
          " are written to STDERR\n";
      absl::log_internal::WriteToStderr(w, absl::LogSeverity::kWarning);
    });

    if (!entry.stacktrace().empty()) {
      absl::log_internal::WriteToStderr(entry.stacktrace(),
                                        entry.log_severity());
    } else {
      // TODO(b/226937039): do this outside else condition once we avoid
      // ReprintFatalMessage
      absl::log_internal::WriteToStderr(
          entry.text_message_with_prefix_and_newline(), entry.log_severity());
    }
  }